

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall CFFFileInput::ReadTopDictIndex(CFFFileInput *this,unsigned_short inFontIndex)

{
  undefined1 auVar1 [16];
  LongFilePositionType LVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  TopDictInfo *pTVar6;
  ulong uVar7;
  TopDictInfo *local_70;
  EStatusCode local_30;
  ushort local_2a;
  EStatusCode status;
  unsigned_short dictionariesCount;
  unsigned_long *offsets;
  CFFFileInput *pCStack_18;
  unsigned_short inFontIndex_local;
  CFFFileInput *this_local;
  
  offsets._6_2_ = inFontIndex;
  pCStack_18 = this;
  LVar2 = CFFPrimitiveReader::GetCurrentPosition(&this->mPrimitivesReader);
  this->mTopDictIndexPosition = LVar2;
  local_30 = ReadIndexHeader(this,(unsigned_long **)&status,&local_2a);
  if (local_30 == eSuccess) {
    uVar3 = CONCAT62(0,local_2a);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0x50),0);
    uVar7 = uVar4 + 8;
    if (SUB168(auVar1 * ZEXT816(0x50),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar7 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar7);
    *puVar5 = uVar3;
    pTVar6 = (TopDictInfo *)(puVar5 + 1);
    if (uVar3 != 0) {
      local_70 = pTVar6;
      do {
        TopDictInfo::TopDictInfo(local_70);
        local_70 = local_70 + 1;
      } while (local_70 != pTVar6 + uVar3);
    }
    this->mTopDictIndex = pTVar6;
    if (_status[offsets._6_2_] != 1) {
      CFFPrimitiveReader::Skip(&this->mPrimitivesReader,_status[offsets._6_2_] - 1);
    }
    local_30 = ReadDict(this,_status[(int)(offsets._6_2_ + 1)] - _status[offsets._6_2_],
                        &this->mTopDictIndex[offsets._6_2_].mTopDict);
  }
  if (_status != (unsigned_long *)0x0) {
    operator_delete__(_status);
  }
  if (local_30 == eSuccess) {
    this_local._4_4_ = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  }
  else {
    this_local._4_4_ = local_30;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFFileInput::ReadTopDictIndex(unsigned short inFontIndex)
{
	mTopDictIndexPosition = mPrimitivesReader.GetCurrentPosition();

	// will read only what's necessary for the font index, nulling items in the path
	
	unsigned long* offsets;
	unsigned short dictionariesCount;
	EStatusCode status = ReadIndexHeader(&offsets,dictionariesCount);
	
	do
	{
		if(status != PDFHummus::eSuccess)
			break;

		// allocate all, but read just the required font
		mTopDictIndex = new TopDictInfo[dictionariesCount];

		if(offsets[inFontIndex] != 1)
			mPrimitivesReader.Skip(offsets[inFontIndex] - 1);
		status = ReadDict(offsets[inFontIndex+1] - offsets[inFontIndex],mTopDictIndex[inFontIndex].mTopDict);
	}while(false);

	delete[] offsets;
	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}